

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printHelp(string *progName)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"usage: ");
  poVar1 = std::operator<<(poVar1,(string *)progName);
  poVar1 = std::operator<<(poVar1," [options]");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  basic user options: ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"    -h --help   \tshow this message");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"    -v --version\tshow version");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "when no options are specified program waits for input of exam answers and total points on stdin in the following format: "
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"<p> <q>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"a_1a_2...a_q <total points for student a>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"b_1b_2...b_q <total points for student b>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"...");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"p_1p_2...p_q <total points for student p>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"where p is positive integer representing the number of students "
                          );
  poVar1 = std::operator<<(poVar1,
                           "and q is a positive integer representing the number of exam questions ")
  ;
  poVar1 = std::operator<<(poVar1,
                           "For each question all students answered either 1 or 0 represented by the a_1a_2...a_q"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Example:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"3 5");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"01101 4");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"10100 3");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"00011 3");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "once input is given the program will calculate all possibilies of exams that could lead to the scores. "
                          );
  poVar1 = std::operator<<(poVar1,
                           "If there is only one way for the exam answers to match the given input the sequence of answers is given, "
                          );
  poVar1 = std::operator<<(poVar1,"else only the number of possible sequences is given.");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  printVersion();
  return;
}

Assistant:

void printHelp(const std::string& progName)
{
	std::cout
		<< "usage: " << progName << " [options]" << std::endl
		<< "  basic user options: " << std::endl
		<< "    -h --help   \tshow this message" << std::endl
		<< "    -v --version\tshow version" << std::endl
		<< std::endl
		<< "when no options are specified program waits for input of exam answers and total points on stdin in the "
		   "following format: "
		<< std::endl
		<< std::endl
		<< "<p> <q>" << std::endl
		<< "a_1a_2...a_q <total points for student a>" << std::endl
		<< "b_1b_2...b_q <total points for student b>" << std::endl
		<< "..." << std::endl
		<< "p_1p_2...p_q <total points for student p>" << std::endl
		<< std::endl
		<< "where p is positive integer representing the number of students "
		<< "and q is a positive integer representing the number of exam questions "
		<< "For each question all students answered either 1 or 0 represented by the a_1a_2...a_q" << std::endl
		<< std::endl << "Example:" << std::endl
		<< "3 5" << std::endl
		<< "01101 4" << std::endl
		<< "10100 3" << std::endl
		<< "00011 3" << std::endl
		<< std::endl
		<< "once input is given the program will calculate all possibilies of exams that could lead to the scores. "
		<< "If there is only one way for the exam answers to match the given input the sequence of answers is given, "
		<< "else only the number of possible sequences is given." << std::endl
		<< std::endl;

	printVersion();
}